

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  int iVar1;
  Rep *pRVar2;
  LogMessage *pLVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this == other) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x91b);
    pLVar3 = LogMessage::operator<<(&local_50,"CHECK failed: this != other: ");
    LogFinisher::operator=(&local_51,pLVar3);
    LogMessage::~LogMessage(&local_50);
  }
  if (this->arena_ != other->arena_) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x91c);
    pLVar3 = LogMessage::operator<<
                       (&local_50,
                        "CHECK failed: GetArenaNoVirtual() == other->GetArenaNoVirtual(): ");
    LogFinisher::operator=(&local_51,pLVar3);
    LogMessage::~LogMessage(&local_50);
  }
  pRVar2 = this->rep_;
  this->rep_ = other->rep_;
  other->rep_ = pRVar2;
  iVar1 = this->current_size_;
  this->current_size_ = other->current_size_;
  other->current_size_ = iVar1;
  iVar1 = this->total_size_;
  this->total_size_ = other->total_size_;
  other->total_size_ = iVar1;
  return;
}

Assistant:

void RepeatedPtrFieldBase::InternalSwap(RepeatedPtrFieldBase* other) {
  GOOGLE_DCHECK(this != other);
  GOOGLE_DCHECK(GetArenaNoVirtual() == other->GetArenaNoVirtual());

  std::swap(rep_, other->rep_);
  std::swap(current_size_, other->current_size_);
  std::swap(total_size_, other->total_size_);
}